

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibi.cpp
# Opt level: O1

bool file_exist(char *path)

{
  FILE *__stream;
  
  __stream = fopen(path,"rb");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

static bool file_exist(const char * path)
{
	FILE * f = fopen(path, "rb");

	if (f == nullptr)
		return false;
	else
	{
		fclose(f);
		f = nullptr;

		return true;
	}
}